

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersector1<8,_1,_false,_embree::avx512::SubGridIntersector1Moeller<8,_true>_>::intersect
               (Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  Geometry *pGVar8;
  long lVar9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  RTCRayQueryContext *pRVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  ulong uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  byte bVar31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [16];
  byte bVar41;
  long lVar42;
  long lVar43;
  byte bVar44;
  uint uVar45;
  ulong uVar46;
  ulong uVar47;
  uint uVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  long lVar53;
  Geometry *geometry;
  long lVar54;
  undefined8 unaff_R15;
  ulong uVar55;
  bool bVar56;
  uint uVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined4 uVar79;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  float fVar84;
  float fVar85;
  undefined1 auVar86 [16];
  float fVar87;
  float fVar92;
  float fVar93;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar94;
  undefined1 auVar91 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [64];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  float fVar108;
  float fVar109;
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  uint uVar113;
  uint uVar114;
  float fVar115;
  float fVar116;
  uint uVar117;
  undefined1 auVar118 [32];
  undefined1 auVar119 [64];
  undefined1 auVar120 [64];
  undefined1 auVar121 [64];
  undefined1 auVar122 [64];
  undefined1 auVar123 [64];
  undefined1 auVar124 [64];
  undefined1 auVar125 [64];
  undefined1 auVar126 [64];
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<8> dist;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  long lStack_2788;
  ulong *local_2778;
  int local_275c;
  RTCIntersectArguments *local_2758;
  ulong local_2750;
  ulong local_2748;
  RTCRayQueryContext *local_2740;
  ulong local_2738;
  ulong local_2730;
  ulong local_2728;
  ulong local_2720;
  ulong local_2718;
  ulong local_2710;
  ulong local_2708;
  ulong local_2700;
  ulong local_26f8;
  ulong local_26f0;
  ulong local_26e8;
  ulong local_26e0;
  long local_26d8;
  long local_26d0;
  long local_26c8;
  RTCFilterFunctionNArguments local_26c0;
  float local_2690;
  undefined4 local_268c;
  undefined4 local_2688;
  float local_2684;
  float local_2680;
  uint local_267c;
  undefined4 local_2678;
  uint local_2674;
  uint local_2670;
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  float local_2620;
  float fStack_261c;
  float fStack_2618;
  float fStack_2614;
  float fStack_2610;
  float fStack_260c;
  float fStack_2608;
  float fStack_2604;
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  byte local_259f;
  float local_2580 [4];
  float fStack_2570;
  float fStack_256c;
  float fStack_2568;
  undefined4 uStack_2564;
  float local_2560 [4];
  float fStack_2550;
  float fStack_254c;
  float fStack_2548;
  float fStack_2544;
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  ulong local_23a0;
  undefined4 local_2398 [2];
  ulong local_2390 [1132];
  undefined1 auVar65 [32];
  
  local_23a0 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 != 8) {
    local_2778 = local_2390;
    local_2398[0] = 0;
    aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar18 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar90 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar58._8_4_ = 0x7fffffff;
    auVar58._0_8_ = 0x7fffffff7fffffff;
    auVar58._12_4_ = 0x7fffffff;
    auVar58 = vandps_avx512vl((undefined1  [16])aVar2,auVar58);
    auVar99._8_4_ = 0x219392ef;
    auVar99._0_8_ = 0x219392ef219392ef;
    auVar99._12_4_ = 0x219392ef;
    uVar55 = vcmpps_avx512vl(auVar58,auVar99,1);
    bVar56 = (bool)((byte)uVar55 & 1);
    auVar59._0_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * (int)aVar2.x;
    bVar56 = (bool)((byte)(uVar55 >> 1) & 1);
    auVar59._4_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * (int)aVar2.y;
    bVar56 = (bool)((byte)(uVar55 >> 2) & 1);
    auVar59._8_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * (int)aVar2.z;
    bVar56 = (bool)((byte)(uVar55 >> 3) & 1);
    auVar59._12_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * aVar2.field_3.a;
    auVar58 = vrcp14ps_avx512vl(auVar59);
    auVar60._8_4_ = 0x3f800000;
    auVar60._0_8_ = 0x3f8000003f800000;
    auVar60._12_4_ = 0x3f800000;
    auVar60 = vfnmadd213ps_avx512vl(auVar59,auVar58,auVar60);
    auVar59 = vfmadd132ps_fma(auVar60,auVar58,auVar58);
    fVar84 = auVar59._0_4_;
    auVar61 = vbroadcastss_avx512vl(auVar59);
    auVar119 = ZEXT3264(auVar61);
    auVar58 = vmovshdup_avx(auVar59);
    auVar61 = vbroadcastsd_avx512vl(auVar58);
    auVar120 = ZEXT3264(auVar61);
    auVar60 = vshufpd_avx(auVar59,auVar59,1);
    auVar65._8_4_ = 2;
    auVar65._0_8_ = 0x200000002;
    auVar65._12_4_ = 2;
    auVar65._16_4_ = 2;
    auVar65._20_4_ = 2;
    auVar65._24_4_ = 2;
    auVar65._28_4_ = 2;
    auVar61 = vpermps_avx512vl(auVar65,ZEXT1632(auVar59));
    auVar121 = ZEXT3264(auVar61);
    fVar85 = fVar84 * (ray->super_RayK<1>).org.field_0.m128[0];
    auVar67._4_4_ = fVar85;
    auVar67._0_4_ = fVar85;
    auVar67._8_4_ = fVar85;
    auVar67._12_4_ = fVar85;
    auVar67._16_4_ = fVar85;
    auVar67._20_4_ = fVar85;
    auVar67._24_4_ = fVar85;
    auVar67._28_4_ = fVar85;
    auVar61 = vbroadcastss_avx512vl(ZEXT416(1));
    auVar122 = ZEXT3264(auVar61);
    auVar63 = ZEXT1632(CONCAT412(auVar59._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3],
                                 CONCAT48(auVar59._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2],
                                          CONCAT44(auVar59._4_4_ *
                                                   (ray->super_RayK<1>).org.field_0.m128[1],fVar85))
                                ));
    auVar62 = vpermps_avx512vl(auVar61,auVar63);
    auVar61 = vpermps_avx2(auVar65,auVar63);
    uVar55 = (ulong)(fVar84 < 0.0) << 5;
    uVar47 = (ulong)(auVar58._0_4_ < 0.0) << 5 | 0x40;
    uVar49 = (ulong)(auVar60._0_4_ < 0.0) << 5 | 0x80;
    uVar50 = uVar55 ^ 0x20;
    uVar51 = uVar47 ^ 0x20;
    uVar52 = uVar49 ^ 0x20;
    auVar64._8_4_ = 0x80000000;
    auVar64._0_8_ = 0x8000000080000000;
    auVar64._12_4_ = 0x80000000;
    auVar64._16_4_ = 0x80000000;
    auVar64._20_4_ = 0x80000000;
    auVar64._24_4_ = 0x80000000;
    auVar64._28_4_ = 0x80000000;
    auVar63 = vbroadcastss_avx512vl(auVar90);
    auVar124 = ZEXT3264(auVar63);
    auVar63 = vxorps_avx512vl(auVar67,auVar64);
    auVar123 = ZEXT3264(auVar63);
    auVar62 = vxorps_avx512vl(auVar62,auVar64);
    auVar125 = ZEXT3264(auVar62);
    auVar61 = vxorps_avx512vl(auVar61,auVar64);
    auVar126 = ZEXT3264(auVar61);
    auVar61 = vbroadcastss_avx512vl(auVar18);
    auVar127 = ZEXT3264(auVar61);
    local_2710 = (ulong)(((uint)(fVar84 < 0.0) << 5) >> 2);
    local_2718 = uVar50 >> 2;
    local_2720 = uVar47 >> 2;
    local_2728 = uVar51 >> 2;
    local_2730 = uVar49 >> 2;
    auVar61 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
    auVar128 = ZEXT3264(auVar61);
    auVar105 = ZEXT3264(CONCAT428(0xfffffff8,
                                  CONCAT424(0xfffffff8,
                                            CONCAT420(0xfffffff8,
                                                      CONCAT416(0xfffffff8,
                                                                CONCAT412(0xfffffff8,
                                                                          CONCAT48(0xfffffff8,
                                                                                                                                                                      
                                                  0xfffffff8fffffff8)))))));
    local_2738 = uVar52 >> 2;
    local_26e0 = uVar55;
    local_26e8 = uVar47;
    local_26f0 = uVar49;
    local_26f8 = uVar50;
    local_2700 = uVar51;
    local_2708 = uVar52;
LAB_01c807b3:
    if (local_2778 != &local_23a0) {
      pfVar1 = (float *)(local_2778 + -1);
      local_2778 = local_2778 + -2;
      if (*pfVar1 <= (ray->super_RayK<1>).tfar) {
        uVar46 = *local_2778;
LAB_01c807dd:
        do {
          if ((uVar46 & 8) != 0) goto LAB_01c80b47;
          auVar61 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar46 + 0x40 + uVar55),auVar123._0_32_,
                               auVar119._0_32_);
          auVar62 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar46 + 0x40 + uVar47),auVar125._0_32_,
                               auVar120._0_32_);
          auVar61 = vpmaxsd_avx2(auVar61,auVar62);
          auVar63 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar46 + 0x40 + uVar49),auVar126._0_32_,
                               auVar121._0_32_);
          auVar62 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar46 + 0x40 + uVar50),auVar123._0_32_,
                               auVar119._0_32_);
          auVar64 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar46 + 0x40 + uVar51),auVar125._0_32_,
                               auVar120._0_32_);
          auVar62 = vpminsd_avx2(auVar62,auVar64);
          auVar64 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar46 + 0x40 + uVar52),auVar126._0_32_,
                               auVar121._0_32_);
          auVar63 = vpmaxsd_avx512vl(auVar63,auVar127._0_32_);
          auVar61 = vpmaxsd_avx2(auVar61,auVar63);
          auVar63 = vpminsd_avx512vl(auVar64,auVar124._0_32_);
          auVar62 = vpminsd_avx2(auVar62,auVar63);
          uVar28 = vpcmpd_avx512vl(auVar61,auVar62,2);
          bVar44 = (byte)uVar28;
          if (bVar44 == 0) break;
          auVar62 = *(undefined1 (*) [32])(uVar46 & 0xfffffffffffffff0);
          auVar63 = ((undefined1 (*) [32])(uVar46 & 0xfffffffffffffff0))[1];
          auVar64 = vmovdqa64_avx512vl(auVar128._0_32_);
          auVar64 = vpternlogd_avx512vl(auVar64,auVar61,auVar105._0_32_,0xf8);
          auVar65 = vpcompressd_avx512vl(auVar64);
          auVar66._0_4_ =
               (uint)(bVar44 & 1) * auVar65._0_4_ | (uint)!(bool)(bVar44 & 1) * auVar64._0_4_;
          bVar56 = (bool)((byte)(uVar28 >> 1) & 1);
          auVar66._4_4_ = (uint)bVar56 * auVar65._4_4_ | (uint)!bVar56 * auVar64._4_4_;
          bVar56 = (bool)((byte)(uVar28 >> 2) & 1);
          auVar66._8_4_ = (uint)bVar56 * auVar65._8_4_ | (uint)!bVar56 * auVar64._8_4_;
          bVar56 = (bool)((byte)(uVar28 >> 3) & 1);
          auVar66._12_4_ = (uint)bVar56 * auVar65._12_4_ | (uint)!bVar56 * auVar64._12_4_;
          bVar56 = (bool)((byte)(uVar28 >> 4) & 1);
          auVar66._16_4_ = (uint)bVar56 * auVar65._16_4_ | (uint)!bVar56 * auVar64._16_4_;
          bVar56 = (bool)((byte)(uVar28 >> 5) & 1);
          auVar66._20_4_ = (uint)bVar56 * auVar65._20_4_ | (uint)!bVar56 * auVar64._20_4_;
          bVar56 = (bool)((byte)(uVar28 >> 6) & 1);
          auVar66._24_4_ = (uint)bVar56 * auVar65._24_4_ | (uint)!bVar56 * auVar64._24_4_;
          bVar56 = SUB81(uVar28 >> 7,0);
          auVar66._28_4_ = (uint)bVar56 * auVar65._28_4_ | (uint)!bVar56 * auVar64._28_4_;
          auVar64 = vpermt2q_avx512vl(auVar62,auVar66,auVar63);
          uVar46 = auVar64._0_8_;
          bVar44 = bVar44 - 1 & bVar44;
          if (bVar44 != 0) {
            auVar64 = vpshufd_avx2(auVar66,0x55);
            vpermt2q_avx512vl(auVar62,auVar64,auVar63);
            auVar65 = vpminsd_avx2(auVar66,auVar64);
            auVar64 = vpmaxsd_avx2(auVar66,auVar64);
            bVar44 = bVar44 - 1 & bVar44;
            if (bVar44 == 0) {
              auVar65 = vpermi2q_avx512vl(auVar65,auVar62,auVar63);
              uVar46 = auVar65._0_8_;
              auVar62 = vpermt2q_avx512vl(auVar62,auVar64,auVar63);
              *local_2778 = auVar62._0_8_;
              lVar42 = 8;
              lStack_2788 = 0x10;
            }
            else {
              auVar73 = vpshufd_avx2(auVar66,0xaa);
              vpermt2q_avx512vl(auVar62,auVar73,auVar63);
              auVar67 = vpminsd_avx2(auVar65,auVar73);
              auVar65 = vpmaxsd_avx2(auVar65,auVar73);
              auVar73 = vpminsd_avx2(auVar64,auVar65);
              auVar65 = vpmaxsd_avx2(auVar64,auVar65);
              bVar44 = bVar44 - 1 & bVar44;
              if (bVar44 == 0) {
                auVar64 = vpermi2q_avx512vl(auVar67,auVar62,auVar63);
                uVar46 = auVar64._0_8_;
                auVar64 = vpermt2q_avx512vl(auVar62,auVar65,auVar63);
                *local_2778 = auVar64._0_8_;
                auVar64 = vpermd_avx2(auVar65,auVar61);
                *(int *)(local_2778 + 1) = auVar64._0_4_;
                auVar62 = vpermt2q_avx512vl(auVar62,auVar73,auVar63);
                local_2778[2] = auVar62._0_8_;
                lVar42 = 0x18;
                lStack_2788 = 0x20;
                auVar64 = auVar73;
              }
              else {
                auVar64 = vpshufd_avx2(auVar66,0xff);
                vpermt2q_avx512vl(auVar62,auVar64,auVar63);
                auVar69 = vpminsd_avx2(auVar67,auVar64);
                auVar67 = vpmaxsd_avx2(auVar67,auVar64);
                auVar64 = vpminsd_avx2(auVar73,auVar67);
                auVar67 = vpmaxsd_avx2(auVar73,auVar67);
                auVar73 = vpminsd_avx2(auVar65,auVar67);
                auVar65 = vpmaxsd_avx2(auVar65,auVar67);
                bVar44 = bVar44 - 1 & bVar44;
                if (bVar44 != 0) {
                  auVar68 = valignd_avx512vl(auVar66,auVar66,3);
                  auVar67 = vpmovsxbd_avx2(ZEXT816(0x303020108));
                  auVar69 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                 CONCAT48(0x80000000,
                                                                          0x8000000080000000))),
                                              auVar67,auVar69);
                  auVar67 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                  auVar64 = vpermt2d_avx512vl(auVar69,auVar67,auVar64);
                  auVar67 = vpermt2d_avx512vl(auVar64,auVar67,auVar73);
                  auVar64 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                  auVar64 = vpermt2d_avx512vl(auVar67,auVar64,auVar65);
                  auVar105 = ZEXT3264(auVar64);
                  bVar41 = bVar44;
                  do {
                    auVar65 = auVar105._0_32_;
                    auVar64 = vpermps_avx512vl(auVar122._0_32_,auVar68);
                    auVar68 = valignd_avx512vl(auVar68,auVar68,1);
                    vpermt2q_avx512vl(auVar62,auVar68,auVar63);
                    bVar41 = bVar41 - 1 & bVar41;
                    uVar29 = vpcmpd_avx512vl(auVar64,auVar65,5);
                    auVar64 = vpmaxsd_avx2(auVar64,auVar65);
                    bVar31 = (byte)uVar29 << 1;
                    auVar65 = valignd_avx512vl(auVar65,auVar65,7);
                    bVar56 = (bool)((byte)uVar29 & 1);
                    bVar13 = (bool)(bVar31 >> 2 & 1);
                    bVar14 = (bool)(bVar31 >> 3 & 1);
                    bVar15 = (bool)(bVar31 >> 4 & 1);
                    bVar16 = (bool)(bVar31 >> 5 & 1);
                    bVar17 = (bool)(bVar31 >> 6 & 1);
                    auVar105 = ZEXT3264(CONCAT428((uint)(bVar31 >> 7) * auVar65._28_4_ |
                                                  (uint)!(bool)(bVar31 >> 7) * auVar64._28_4_,
                                                  CONCAT424((uint)bVar17 * auVar65._24_4_ |
                                                            (uint)!bVar17 * auVar64._24_4_,
                                                            CONCAT420((uint)bVar16 * auVar65._20_4_
                                                                      | (uint)!bVar16 *
                                                                        auVar64._20_4_,
                                                                      CONCAT416((uint)bVar15 *
                                                                                auVar65._16_4_ |
                                                                                (uint)!bVar15 *
                                                                                auVar64._16_4_,
                                                                                CONCAT412((uint)
                                                  bVar14 * auVar65._12_4_ |
                                                  (uint)!bVar14 * auVar64._12_4_,
                                                  CONCAT48((uint)bVar13 * auVar65._8_4_ |
                                                           (uint)!bVar13 * auVar64._8_4_,
                                                           CONCAT44((uint)bVar56 * auVar65._4_4_ |
                                                                    (uint)!bVar56 * auVar64._4_4_,
                                                                    auVar64._0_4_))))))));
                  } while (bVar41 != 0);
                  lVar42 = (ulong)(uint)POPCOUNT((uint)bVar44) + 3;
                  while( true ) {
                    auVar65 = auVar105._0_32_;
                    auVar64 = vpermt2q_avx512vl(auVar62,auVar65,auVar63);
                    uVar46 = auVar64._0_8_;
                    bVar56 = lVar42 == 0;
                    lVar42 = lVar42 + -1;
                    if (bVar56) break;
                    *local_2778 = uVar46;
                    auVar64 = vpermd_avx2(auVar65,auVar61);
                    *(int *)(local_2778 + 1) = auVar64._0_4_;
                    auVar64 = valignd_avx512vl(auVar65,auVar65,1);
                    auVar105 = ZEXT3264(auVar64);
                    local_2778 = local_2778 + 2;
                  }
                  auVar105 = ZEXT3264(CONCAT428(0xfffffff8,
                                                CONCAT424(0xfffffff8,
                                                          CONCAT420(0xfffffff8,
                                                                    CONCAT416(0xfffffff8,
                                                                              CONCAT412(0xfffffff8,
                                                                                        CONCAT48(
                                                  0xfffffff8,0xfffffff8fffffff8)))))));
                  goto LAB_01c807dd;
                }
                auVar67 = vpermi2q_avx512vl(auVar69,auVar62,auVar63);
                uVar46 = auVar67._0_8_;
                auVar67 = vpermt2q_avx512vl(auVar62,auVar65,auVar63);
                *local_2778 = auVar67._0_8_;
                auVar65 = vpermd_avx2(auVar65,auVar61);
                *(int *)(local_2778 + 1) = auVar65._0_4_;
                auVar65 = vpermt2q_avx512vl(auVar62,auVar73,auVar63);
                local_2778[2] = auVar65._0_8_;
                auVar65 = vpermd_avx2(auVar73,auVar61);
                *(int *)(local_2778 + 3) = auVar65._0_4_;
                auVar62 = vpermt2q_avx512vl(auVar62,auVar64,auVar63);
                local_2778[4] = auVar62._0_8_;
                lStack_2788 = 0x28;
                lVar42 = lStack_2788;
                lStack_2788 = 0x30;
              }
              auVar105 = ZEXT3264(CONCAT428(0xfffffff8,
                                            CONCAT424(0xfffffff8,
                                                      CONCAT420(0xfffffff8,
                                                                CONCAT416(0xfffffff8,
                                                                          CONCAT412(0xfffffff8,
                                                                                    CONCAT48(
                                                  0xfffffff8,0xfffffff8fffffff8)))))));
            }
            auVar61 = vpermd_avx2(auVar64,auVar61);
            *(int *)((long)local_2778 + lVar42) = auVar61._0_4_;
            local_2778 = (ulong *)((long)local_2778 + lStack_2788);
          }
        } while( true );
      }
      goto LAB_01c807b3;
    }
  }
  return;
LAB_01c80b47:
  local_26d8 = (ulong)((uint)uVar46 & 0xf) - 8;
  uVar46 = uVar46 & 0xfffffffffffffff0;
  for (local_26d0 = 0; local_26d0 != local_26d8; local_26d0 = local_26d0 + 1) {
    lVar42 = local_26d0 * 0x90;
    local_26c8 = uVar46 + lVar42;
    auVar80._8_8_ = 0;
    auVar80._0_8_ = *(ulong *)(uVar46 + 0x40 + lVar42);
    auVar86._8_8_ = 0;
    auVar86._0_8_ = *(ulong *)(uVar46 + 0x48 + lVar42);
    uVar29 = vpcmpub_avx512vl(auVar80,auVar86,2);
    uVar79 = *(undefined4 *)(uVar46 + 0x70 + lVar42);
    auVar62._4_4_ = uVar79;
    auVar62._0_4_ = uVar79;
    auVar62._8_4_ = uVar79;
    auVar62._12_4_ = uVar79;
    auVar62._16_4_ = uVar79;
    auVar62._20_4_ = uVar79;
    auVar62._24_4_ = uVar79;
    auVar62._28_4_ = uVar79;
    uVar79 = *(undefined4 *)(uVar46 + 0x7c + lVar42);
    auVar69._4_4_ = uVar79;
    auVar69._0_4_ = uVar79;
    auVar69._8_4_ = uVar79;
    auVar69._12_4_ = uVar79;
    auVar69._16_4_ = uVar79;
    auVar69._20_4_ = uVar79;
    auVar69._24_4_ = uVar79;
    auVar69._28_4_ = uVar79;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = *(ulong *)(local_2710 + 0x40 + local_26c8);
    auVar61 = vpmovzxbd_avx2(auVar18);
    auVar61 = vcvtdq2ps_avx(auVar61);
    auVar18 = vfmadd213ps_fma(auVar61,auVar69,auVar62);
    auVar90._8_8_ = 0;
    auVar90._0_8_ = *(ulong *)(local_2718 + 0x40 + local_26c8);
    auVar61 = vpmovzxbd_avx2(auVar90);
    auVar61 = vcvtdq2ps_avx(auVar61);
    auVar90 = vfmadd213ps_fma(auVar61,auVar69,auVar62);
    uVar79 = *(undefined4 *)(uVar46 + 0x74 + lVar42);
    auVar63._4_4_ = uVar79;
    auVar63._0_4_ = uVar79;
    auVar63._8_4_ = uVar79;
    auVar63._12_4_ = uVar79;
    auVar63._16_4_ = uVar79;
    auVar63._20_4_ = uVar79;
    auVar63._24_4_ = uVar79;
    auVar63._28_4_ = uVar79;
    uVar79 = *(undefined4 *)(uVar46 + 0x80 + lVar42);
    auVar68._4_4_ = uVar79;
    auVar68._0_4_ = uVar79;
    auVar68._8_4_ = uVar79;
    auVar68._12_4_ = uVar79;
    auVar68._16_4_ = uVar79;
    auVar68._20_4_ = uVar79;
    auVar68._24_4_ = uVar79;
    auVar68._28_4_ = uVar79;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = *(ulong *)(local_2720 + 0x40 + local_26c8);
    auVar61 = vpmovzxbd_avx2(auVar3);
    auVar61 = vcvtdq2ps_avx(auVar61);
    auVar58 = vfmadd213ps_fma(auVar61,auVar68,auVar63);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = *(ulong *)(local_2728 + 0x40 + local_26c8);
    auVar61 = vpmovzxbd_avx2(auVar4);
    auVar61 = vcvtdq2ps_avx(auVar61);
    auVar60 = vfmadd213ps_fma(auVar61,auVar68,auVar63);
    uVar79 = *(undefined4 *)(uVar46 + 0x78 + lVar42);
    auVar73._4_4_ = uVar79;
    auVar73._0_4_ = uVar79;
    auVar73._8_4_ = uVar79;
    auVar73._12_4_ = uVar79;
    auVar73._16_4_ = uVar79;
    auVar73._20_4_ = uVar79;
    auVar73._24_4_ = uVar79;
    auVar73._28_4_ = uVar79;
    uVar79 = *(undefined4 *)(uVar46 + 0x84 + lVar42);
    auVar70._4_4_ = uVar79;
    auVar70._0_4_ = uVar79;
    auVar70._8_4_ = uVar79;
    auVar70._12_4_ = uVar79;
    auVar70._16_4_ = uVar79;
    auVar70._20_4_ = uVar79;
    auVar70._24_4_ = uVar79;
    auVar70._28_4_ = uVar79;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = *(ulong *)(local_2730 + 0x40 + local_26c8);
    auVar61 = vpmovzxbd_avx2(auVar5);
    auVar61 = vcvtdq2ps_avx(auVar61);
    auVar59 = vfmadd213ps_fma(auVar61,auVar70,auVar73);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = *(ulong *)(local_2738 + 0x40 + local_26c8);
    auVar61 = vpmovzxbd_avx2(auVar6);
    auVar61 = vcvtdq2ps_avx(auVar61);
    auVar99 = vfmadd213ps_fma(auVar61,auVar70,auVar73);
    auVar61 = vfmadd213ps_avx512vl(ZEXT1632(auVar18),auVar119._0_32_,auVar123._0_32_);
    auVar62 = vfmadd213ps_avx512vl(ZEXT1632(auVar58),auVar120._0_32_,auVar125._0_32_);
    auVar61 = vpmaxsd_avx2(auVar61,auVar62);
    auVar63 = vfmadd213ps_avx512vl(ZEXT1632(auVar59),auVar121._0_32_,auVar126._0_32_);
    auVar62 = vfmadd213ps_avx512vl(ZEXT1632(auVar90),auVar119._0_32_,auVar123._0_32_);
    auVar64 = vfmadd213ps_avx512vl(ZEXT1632(auVar60),auVar120._0_32_,auVar125._0_32_);
    auVar62 = vpminsd_avx2(auVar62,auVar64);
    auVar64 = vfmadd213ps_avx512vl(ZEXT1632(auVar99),auVar121._0_32_,auVar126._0_32_);
    auVar63 = vpmaxsd_avx512vl(auVar63,auVar127._0_32_);
    local_23c0 = vpmaxsd_avx2(auVar61,auVar63);
    auVar61 = vpminsd_avx512vl(auVar64,auVar124._0_32_);
    auVar61 = vpminsd_avx2(auVar62,auVar61);
    uVar30 = vpcmpd_avx512vl(local_23c0,auVar61,2);
    uVar55 = CONCAT44((int)((ulong)unaff_R15 >> 0x20),(uint)(byte)((byte)uVar29 & (byte)uVar30));
LAB_01c80ca0:
    while (uVar55 != 0) {
      lVar42 = 0;
      for (uVar47 = uVar55; (uVar47 & 1) == 0; uVar47 = uVar47 >> 1 | 0x8000000000000000) {
        lVar42 = lVar42 + 1;
      }
      uVar55 = uVar55 - 1 & uVar55;
      fVar84 = (ray->super_RayK<1>).tfar;
      if (*(float *)(local_23c0 + lVar42 * 4) <= fVar84) {
        uVar48 = *(uint *)(local_26c8 + 0x88);
        uVar7 = *(uint *)(local_26c8 + 4 + lVar42 * 8);
        local_2748 = (ulong)uVar48;
        pGVar8 = (context->scene->geometries).items[uVar48].ptr;
        lVar9 = *(long *)&pGVar8->field_0x58;
        lVar10 = *(long *)&pGVar8[1].time_range.upper;
        lVar43 = pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i *
                 (ulong)uVar7;
        uVar47 = *(ulong *)(local_26c8 + lVar42 * 8);
        auVar88._8_2_ = 0x7fff;
        auVar88._0_8_ = 0x7fff7fff7fff7fff;
        auVar88._10_2_ = 0x7fff;
        auVar88._12_2_ = 0x7fff;
        auVar88._14_2_ = 0x7fff;
        auVar81._8_8_ = 0;
        auVar81._0_8_ = uVar47;
        auVar18 = vpand_avx(auVar81,auVar88);
        auVar99 = vpmovzxwd_avx(auVar18);
        auVar89._8_8_ = 0;
        auVar89._0_8_ = *(ulong *)(lVar9 + lVar43);
        auVar18 = vpaddd_avx(auVar89,auVar99);
        auVar90 = vpmulld_avx(auVar89,auVar99);
        auVar90 = vpsrlq_avx(auVar90,0x20);
        auVar18 = vpaddd_avx(auVar18,auVar90);
        lVar54 = CONCAT44((int)((ulong)ray >> 0x20),auVar18._0_4_);
        p_Var11 = pGVar8[1].intersectionFilterN;
        auVar18 = *(undefined1 (*) [16])(lVar10 + (lVar54 + 1) * (long)p_Var11);
        uVar50 = *(ulong *)(lVar9 + lVar43) >> 0x20;
        lVar42 = uVar50 + lVar54 + 1;
        auVar90 = *(undefined1 (*) [16])(lVar10 + (uVar50 + lVar54) * (long)p_Var11);
        auVar58 = *(undefined1 (*) [16])(lVar10 + lVar42 * (long)p_Var11);
        uVar49 = (ulong)(-1 < (short)uVar47);
        auVar60 = *(undefined1 (*) [16])(lVar10 + (lVar54 + uVar49 + 1) * (long)p_Var11);
        lVar53 = uVar49 + lVar42;
        auVar59 = *(undefined1 (*) [16])(lVar10 + lVar53 * (long)p_Var11);
        uVar49 = 0;
        if (-1 < (short)(uVar47 >> 0x10)) {
          uVar49 = uVar50;
        }
        auVar3 = *(undefined1 (*) [16])(lVar10 + (uVar50 + lVar54 + uVar49) * (long)p_Var11);
        auVar4 = *(undefined1 (*) [16])(lVar10 + (lVar42 + uVar49) * (long)p_Var11);
        auVar110._16_16_ = *(undefined1 (*) [16])(lVar10 + (uVar49 + lVar53) * (long)p_Var11);
        auVar110._0_16_ = auVar58;
        auVar6 = vunpcklps_avx(auVar18,auVar59);
        auVar5 = vunpckhps_avx(auVar18,auVar59);
        auVar80 = vunpcklps_avx(auVar60,auVar58);
        auVar60 = vunpckhps_avx(auVar60,auVar58);
        auVar86 = vunpcklps_avx(auVar5,auVar60);
        auVar81 = vunpcklps_avx(auVar6,auVar80);
        auVar60 = vunpckhps_avx(auVar6,auVar80);
        auVar6 = vunpcklps_avx(auVar90,auVar4);
        auVar5 = vunpckhps_avx(auVar90,auVar4);
        auVar80 = vunpcklps_avx(auVar58,auVar3);
        auVar3 = vunpckhps_avx(auVar58,auVar3);
        auVar5 = vunpcklps_avx(auVar5,auVar3);
        auVar88 = vunpcklps_avx(auVar6,auVar80);
        auVar3 = vunpckhps_avx(auVar6,auVar80);
        auVar102._16_16_ = auVar4;
        auVar102._0_16_ = auVar90;
        auVar95._16_16_ = auVar59;
        auVar95._0_16_ = auVar18;
        auVar61 = vunpcklps_avx(auVar95,auVar102);
        auVar91._16_16_ = auVar58;
        auVar91._0_16_ = *(undefined1 (*) [16])(lVar10 + (long)p_Var11 * lVar54);
        auVar62 = vunpcklps_avx(auVar91,auVar110);
        auVar69 = vunpcklps_avx(auVar62,auVar61);
        auVar73 = vunpckhps_avx(auVar62,auVar61);
        auVar61 = vunpckhps_avx(auVar95,auVar102);
        auVar62 = vunpckhps_avx(auVar91,auVar110);
        auVar68 = vunpcklps_avx(auVar62,auVar61);
        auVar61._16_16_ = auVar81;
        auVar61._0_16_ = auVar81;
        auVar97._16_16_ = auVar60;
        auVar97._0_16_ = auVar60;
        auVar103._16_16_ = auVar86;
        auVar103._0_16_ = auVar86;
        auVar104._16_16_ = auVar88;
        auVar104._0_16_ = auVar88;
        auVar111._16_16_ = auVar3;
        auVar111._0_16_ = auVar3;
        auVar107._16_16_ = auVar5;
        auVar107._0_16_ = auVar5;
        auVar61 = vsubps_avx(auVar69,auVar61);
        auVar62 = vsubps_avx(auVar73,auVar97);
        auVar63 = vsubps_avx(auVar68,auVar103);
        auVar64 = vsubps_avx(auVar104,auVar69);
        auVar65 = vsubps_avx(auVar111,auVar73);
        auVar67 = vsubps_avx(auVar107,auVar68);
        auVar35._4_4_ = auVar62._4_4_ * auVar67._4_4_;
        auVar35._0_4_ = auVar62._0_4_ * auVar67._0_4_;
        auVar35._8_4_ = auVar62._8_4_ * auVar67._8_4_;
        auVar35._12_4_ = auVar62._12_4_ * auVar67._12_4_;
        auVar35._16_4_ = auVar62._16_4_ * auVar67._16_4_;
        auVar35._20_4_ = auVar62._20_4_ * auVar67._20_4_;
        auVar35._24_4_ = auVar62._24_4_ * auVar67._24_4_;
        auVar35._28_4_ = auVar81._12_4_;
        auVar18 = vfmsub231ps_fma(auVar35,auVar65,auVar63);
        auVar36._4_4_ = auVar63._4_4_ * auVar64._4_4_;
        auVar36._0_4_ = auVar63._0_4_ * auVar64._0_4_;
        auVar36._8_4_ = auVar63._8_4_ * auVar64._8_4_;
        auVar36._12_4_ = auVar63._12_4_ * auVar64._12_4_;
        auVar36._16_4_ = auVar63._16_4_ * auVar64._16_4_;
        auVar36._20_4_ = auVar63._20_4_ * auVar64._20_4_;
        auVar36._24_4_ = auVar63._24_4_ * auVar64._24_4_;
        auVar36._28_4_ = auVar60._12_4_;
        auVar90 = vfmsub231ps_fma(auVar36,auVar67,auVar61);
        auVar37._4_4_ = auVar61._4_4_ * auVar65._4_4_;
        auVar37._0_4_ = auVar61._0_4_ * auVar65._0_4_;
        auVar37._8_4_ = auVar61._8_4_ * auVar65._8_4_;
        auVar37._12_4_ = auVar61._12_4_ * auVar65._12_4_;
        auVar37._16_4_ = auVar61._16_4_ * auVar65._16_4_;
        auVar37._20_4_ = auVar61._20_4_ * auVar65._20_4_;
        auVar37._24_4_ = auVar61._24_4_ * auVar65._24_4_;
        auVar37._28_4_ = auVar86._12_4_;
        auVar70 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).dir.field_0.m128[0]));
        auVar71 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).dir.field_0.m128[1]));
        auVar72 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).dir.field_0.m128[2]));
        uVar79 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
        auVar74._4_4_ = uVar79;
        auVar74._0_4_ = uVar79;
        auVar74._8_4_ = uVar79;
        auVar74._12_4_ = uVar79;
        auVar74._16_4_ = uVar79;
        auVar74._20_4_ = uVar79;
        auVar74._24_4_ = uVar79;
        auVar74._28_4_ = uVar79;
        auVar69 = vsubps_avx512vl(auVar69,auVar74);
        auVar58 = vfmsub231ps_fma(auVar37,auVar64,auVar62);
        uVar79 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
        auVar75._4_4_ = uVar79;
        auVar75._0_4_ = uVar79;
        auVar75._8_4_ = uVar79;
        auVar75._12_4_ = uVar79;
        auVar75._16_4_ = uVar79;
        auVar75._20_4_ = uVar79;
        auVar75._24_4_ = uVar79;
        auVar75._28_4_ = uVar79;
        auVar73 = vsubps_avx512vl(auVar73,auVar75);
        uVar79 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
        auVar76._4_4_ = uVar79;
        auVar76._0_4_ = uVar79;
        auVar76._8_4_ = uVar79;
        auVar76._12_4_ = uVar79;
        auVar76._16_4_ = uVar79;
        auVar76._20_4_ = uVar79;
        auVar76._24_4_ = uVar79;
        auVar76._28_4_ = uVar79;
        auVar68 = vsubps_avx512vl(auVar68,auVar76);
        auVar74 = vmulps_avx512vl(auVar71,auVar68);
        auVar74 = vfmsub231ps_avx512vl(auVar74,auVar73,auVar72);
        auVar75 = vmulps_avx512vl(auVar72,auVar69);
        auVar75 = vfmsub231ps_avx512vl(auVar75,auVar68,auVar70);
        auVar76 = vmulps_avx512vl(auVar70,auVar73);
        auVar76 = vfmsub231ps_avx512vl(auVar76,auVar69,auVar71);
        auVar72 = vmulps_avx512vl(auVar72,ZEXT1632(auVar58));
        auVar71 = vfmadd231ps_avx512vl(auVar72,ZEXT1632(auVar90),auVar71);
        local_25c0 = vfmadd231ps_avx512vl(auVar71,ZEXT1632(auVar18),auVar70);
        auVar71._8_4_ = 0x7fffffff;
        auVar71._0_8_ = 0x7fffffff7fffffff;
        auVar71._12_4_ = 0x7fffffff;
        auVar71._16_4_ = 0x7fffffff;
        auVar71._20_4_ = 0x7fffffff;
        auVar71._24_4_ = 0x7fffffff;
        auVar71._28_4_ = 0x7fffffff;
        vandps_avx512vl(local_25c0,auVar71);
        auVar67 = vmulps_avx512vl(auVar67,auVar76);
        auVar65 = vfmadd231ps_avx512vl(auVar67,auVar75,auVar65);
        auVar64 = vfmadd231ps_avx512vl(auVar65,auVar74,auVar64);
        auVar72._8_4_ = 0x80000000;
        auVar72._0_8_ = 0x8000000080000000;
        auVar72._12_4_ = 0x80000000;
        auVar72._16_4_ = 0x80000000;
        auVar72._20_4_ = 0x80000000;
        auVar72._24_4_ = 0x80000000;
        auVar72._28_4_ = 0x80000000;
        auVar65 = vandpd_avx512vl(local_25c0,auVar72);
        uVar57 = auVar65._0_4_;
        auVar106._0_4_ = (float)(uVar57 ^ auVar64._0_4_);
        uVar45 = auVar65._4_4_;
        auVar106._4_4_ = (float)(uVar45 ^ auVar64._4_4_);
        uVar113 = auVar65._8_4_;
        auVar106._8_4_ = (float)(uVar113 ^ auVar64._8_4_);
        uVar114 = auVar65._12_4_;
        auVar106._12_4_ = (float)(uVar114 ^ auVar64._12_4_);
        fVar85 = auVar65._16_4_;
        auVar106._16_4_ = (float)((uint)fVar85 ^ auVar64._16_4_);
        fVar115 = auVar65._20_4_;
        auVar106._20_4_ = (float)((uint)fVar115 ^ auVar64._20_4_);
        fVar116 = auVar65._24_4_;
        auVar106._24_4_ = (float)((uint)fVar116 ^ auVar64._24_4_);
        uVar117 = auVar65._28_4_;
        auVar106._28_4_ = (float)(uVar117 ^ auVar64._28_4_);
        auVar63 = vmulps_avx512vl(auVar63,auVar76);
        auVar62 = vfmadd231ps_avx512vl(auVar63,auVar62,auVar75);
        auVar61 = vfmadd231ps_avx512vl(auVar62,auVar61,auVar74);
        auVar112._0_4_ = (float)(uVar57 ^ auVar61._0_4_);
        auVar112._4_4_ = (float)(uVar45 ^ auVar61._4_4_);
        auVar112._8_4_ = (float)(uVar113 ^ auVar61._8_4_);
        auVar112._12_4_ = (float)(uVar114 ^ auVar61._12_4_);
        auVar112._16_4_ = (float)((uint)fVar85 ^ auVar61._16_4_);
        auVar112._20_4_ = (float)((uint)fVar115 ^ auVar61._20_4_);
        auVar112._24_4_ = (float)((uint)fVar116 ^ auVar61._24_4_);
        auVar112._28_4_ = (float)(uVar117 ^ auVar61._28_4_);
        uVar29 = vcmpps_avx512vl(auVar106,ZEXT832(0) << 0x20,5);
        uVar30 = vcmpps_avx512vl(auVar112,ZEXT832(0) << 0x20,5);
        uVar26 = vcmpps_avx512vl(local_25c0,ZEXT832(0) << 0x20,4);
        auVar118._0_4_ = auVar112._0_4_ + auVar106._0_4_;
        auVar118._4_4_ = auVar112._4_4_ + auVar106._4_4_;
        auVar118._8_4_ = auVar112._8_4_ + auVar106._8_4_;
        auVar118._12_4_ = auVar112._12_4_ + auVar106._12_4_;
        auVar118._16_4_ = auVar112._16_4_ + auVar106._16_4_;
        auVar118._20_4_ = auVar112._20_4_ + auVar106._20_4_;
        auVar118._24_4_ = auVar112._24_4_ + auVar106._24_4_;
        auVar118._28_4_ = auVar112._28_4_ + auVar106._28_4_;
        uVar27 = vcmpps_avx512vl(auVar118,local_25c0,2);
        local_259f = (byte)uVar29 & (byte)uVar30 & (byte)uVar26 & (byte)uVar27;
        if (local_259f != 0) {
          auVar38._4_4_ = auVar68._4_4_ * auVar58._4_4_;
          auVar38._0_4_ = auVar68._0_4_ * auVar58._0_4_;
          auVar38._8_4_ = auVar68._8_4_ * auVar58._8_4_;
          auVar38._12_4_ = auVar68._12_4_ * auVar58._12_4_;
          auVar38._16_4_ = auVar68._16_4_ * 0.0;
          auVar38._20_4_ = auVar68._20_4_ * 0.0;
          auVar38._24_4_ = auVar68._24_4_ * 0.0;
          auVar38._28_4_ = auVar68._28_4_;
          auVar60 = vfmadd213ps_fma(auVar73,ZEXT1632(auVar90),auVar38);
          auVar60 = vfmadd213ps_fma(auVar69,ZEXT1632(auVar18),ZEXT1632(auVar60));
          local_25e0._0_4_ = (float)(uVar57 ^ auVar60._0_4_);
          local_25e0._4_4_ = (float)(uVar45 ^ auVar60._4_4_);
          local_25e0._8_4_ = (float)(uVar113 ^ auVar60._8_4_);
          local_25e0._12_4_ = (float)(uVar114 ^ auVar60._12_4_);
          local_25e0._16_4_ = fVar85;
          local_25e0._20_4_ = fVar115;
          local_25e0._24_4_ = fVar116;
          local_25e0._28_4_ = uVar117;
          uVar79 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
          auVar32._4_4_ = uVar79;
          auVar32._0_4_ = uVar79;
          auVar32._8_4_ = uVar79;
          auVar32._12_4_ = uVar79;
          auVar32._16_4_ = uVar79;
          auVar32._20_4_ = uVar79;
          auVar32._24_4_ = uVar79;
          auVar32._28_4_ = uVar79;
          auVar61 = vmulps_avx512vl(local_25c0,auVar32);
          fVar19 = local_25c0._0_4_;
          fVar20 = local_25c0._4_4_;
          auVar39._4_4_ = fVar84 * fVar20;
          auVar39._0_4_ = fVar84 * fVar19;
          fVar21 = local_25c0._8_4_;
          auVar39._8_4_ = fVar84 * fVar21;
          fVar22 = local_25c0._12_4_;
          auVar39._12_4_ = fVar84 * fVar22;
          fVar23 = local_25c0._16_4_;
          auVar39._16_4_ = fVar84 * fVar23;
          fVar24 = local_25c0._20_4_;
          auVar39._20_4_ = fVar84 * fVar24;
          fVar25 = local_25c0._24_4_;
          auVar39._24_4_ = fVar84 * fVar25;
          auVar39._28_4_ = fVar84;
          uVar29 = vcmpps_avx512vl(local_25e0,auVar39,2);
          uVar30 = vcmpps_avx512vl(auVar61,local_25e0,1);
          local_259f = (byte)uVar29 & (byte)uVar30 & local_259f;
          uVar57 = (uint)local_259f;
          if (local_259f != 0) {
            uVar45 = vextractps_avx(SUB3216(*(undefined1 (*) [32])
                                             ((long)&(ray->super_RayK<1>).org.field_0 + 0xc),0x10),2
                                   );
            auVar61 = vsubps_avx(local_25c0,auVar106);
            local_2600 = vblendps_avx(auVar112,auVar61,0xf0);
            auVar61 = vsubps_avx(local_25c0,auVar112);
            fVar84 = (float)DAT_01fbac00;
            local_2520._0_4_ = fVar84 * auVar18._0_4_;
            fVar87 = DAT_01fbac00._4_4_;
            local_2520._4_4_ = fVar87 * auVar18._4_4_;
            fVar92 = DAT_01fbac00._8_4_;
            local_2520._8_4_ = fVar92 * auVar18._8_4_;
            fVar93 = DAT_01fbac00._12_4_;
            local_2520._12_4_ = fVar93 * auVar18._12_4_;
            fVar94 = DAT_01fbac00._16_4_;
            local_2520._16_4_ = fVar94 * 0.0;
            fVar108 = DAT_01fbac00._20_4_;
            local_2520._20_4_ = fVar108 * 0.0;
            fVar109 = DAT_01fbac00._24_4_;
            local_2520._24_4_ = fVar109 * 0.0;
            local_2520._28_4_ = 0;
            local_2500._4_4_ = fVar87 * auVar90._4_4_;
            local_2500._0_4_ = fVar84 * auVar90._0_4_;
            local_2500._8_4_ = fVar92 * auVar90._8_4_;
            local_2500._12_4_ = fVar93 * auVar90._12_4_;
            local_2500._16_4_ = fVar94 * 0.0;
            local_2500._20_4_ = fVar108 * 0.0;
            local_2500._24_4_ = fVar109 * 0.0;
            local_2500._28_4_ = 0;
            auVar61 = vblendps_avx(auVar106,auVar61,0xf0);
            local_24e0._0_4_ = fVar84 * auVar58._0_4_;
            local_24e0._4_4_ = fVar87 * auVar58._4_4_;
            local_24e0._8_4_ = fVar92 * auVar58._8_4_;
            local_24e0._12_4_ = fVar93 * auVar58._12_4_;
            local_24e0._16_4_ = fVar94 * 0.0;
            local_24e0._20_4_ = fVar108 * 0.0;
            local_24e0._24_4_ = fVar109 * 0.0;
            local_24e0._28_4_ = 0;
            uVar79 = auVar99._0_4_;
            auVar98._4_4_ = uVar79;
            auVar98._0_4_ = uVar79;
            auVar98._8_4_ = uVar79;
            auVar98._12_4_ = uVar79;
            auVar98._16_4_ = uVar79;
            auVar98._20_4_ = uVar79;
            auVar98._24_4_ = uVar79;
            auVar98._28_4_ = uVar79;
            auVar62 = vpaddd_avx2(auVar98,_DAT_01fb7740);
            auVar100._0_4_ = (float)(int)(*(ushort *)(lVar9 + 8 + lVar43) - 1);
            auVar100._4_12_ = auVar99._4_12_;
            auVar40._12_4_ = 0;
            auVar40._0_12_ = ZEXT812(0);
            auVar90 = vrcp14ss_avx512f(auVar40 << 0x20,ZEXT416((uint)auVar100._0_4_));
            auVar18 = vfnmadd213ss_fma(auVar90,auVar100,ZEXT416(0x40000000));
            fStack_2608 = auVar18._0_4_ * auVar90._0_4_;
            auVar62 = vcvtdq2ps_avx(auVar62);
            local_2620 = (fVar19 * auVar62._0_4_ + auVar61._0_4_) * fStack_2608;
            fStack_261c = (fVar20 * auVar62._4_4_ + auVar61._4_4_) * fStack_2608;
            fStack_2618 = (fVar21 * auVar62._8_4_ + auVar61._8_4_) * fStack_2608;
            fStack_2614 = (fVar22 * auVar62._12_4_ + auVar61._12_4_) * fStack_2608;
            fStack_2610 = (fVar23 * auVar62._16_4_ + auVar61._16_4_) * fStack_2608;
            fStack_260c = (fVar24 * auVar62._20_4_ + auVar61._20_4_) * fStack_2608;
            fStack_2608 = (fVar25 * auVar62._24_4_ + auVar61._24_4_) * fStack_2608;
            fStack_2604 = auVar62._28_4_ + auVar61._28_4_;
            if ((pGVar8->mask & uVar45) != 0) {
              auVar61 = vpermps_avx512vl(auVar122._0_32_,ZEXT1632(auVar99));
              auVar61 = vpaddd_avx2(auVar61,_DAT_01fb7760);
              auVar61 = vcvtdq2ps_avx(auVar61);
              auVar18 = vcvtsi2ss_avx512f(auVar119._0_16_,*(ushort *)(lVar9 + 10 + lVar43) - 1);
              auVar101._0_12_ = ZEXT812(0);
              auVar101._12_4_ = 0;
              auVar96._4_8_ = auVar101._4_8_;
              auVar96._0_4_ = auVar18._0_4_;
              auVar96._12_4_ = 0;
              auVar90 = vrcp14ss_avx512f(auVar101,auVar96);
              auVar18 = vfnmadd213ss_fma(auVar90,auVar18,ZEXT416(0x40000000));
              fVar84 = auVar90._0_4_ * auVar18._0_4_;
              auVar62 = vrcp14ps_avx512vl(local_25c0);
              auVar33._8_4_ = 0x3f800000;
              auVar33._0_8_ = 0x3f8000003f800000;
              auVar33._12_4_ = 0x3f800000;
              auVar33._16_4_ = 0x3f800000;
              auVar33._20_4_ = 0x3f800000;
              auVar33._24_4_ = 0x3f800000;
              auVar33._28_4_ = 0x3f800000;
              auVar63 = vfnmadd213ps_avx512vl(local_25c0,auVar62,auVar33);
              auVar18 = vfmadd132ps_fma(auVar63,auVar62,auVar62);
              fVar87 = auVar18._0_4_;
              local_2540._0_4_ = fVar87 * local_25e0._0_4_;
              fVar92 = auVar18._4_4_;
              local_2540._4_4_ = fVar92 * local_25e0._4_4_;
              fVar93 = auVar18._8_4_;
              local_2540._8_4_ = fVar93 * local_25e0._8_4_;
              fVar94 = auVar18._12_4_;
              local_2540._12_4_ = fVar94 * local_25e0._12_4_;
              local_2540._16_4_ = fVar85 * 0.0;
              local_2540._20_4_ = fVar115 * 0.0;
              local_2540._24_4_ = fVar116 * 0.0;
              local_2540._28_4_ = 0;
              auVar105 = ZEXT3264(local_2540);
              local_2580[0] = local_2620 * fVar87;
              local_2580[1] = fStack_261c * fVar92;
              local_2580[2] = fStack_2618 * fVar93;
              local_2580[3] = fStack_2614 * fVar94;
              fStack_2570 = fStack_2610 * 0.0;
              fStack_256c = fStack_260c * 0.0;
              fStack_2568 = fStack_2608 * 0.0;
              uStack_2564 = auVar62._28_4_;
              local_2560[0] = (fVar19 * auVar61._0_4_ + local_2600._0_4_) * fVar84 * fVar87;
              local_2560[1] = (fVar20 * auVar61._4_4_ + local_2600._4_4_) * fVar84 * fVar92;
              local_2560[2] = (fVar21 * auVar61._8_4_ + local_2600._8_4_) * fVar84 * fVar93;
              local_2560[3] = (fVar22 * auVar61._12_4_ + local_2600._12_4_) * fVar84 * fVar94;
              fStack_2550 = (fVar23 * auVar61._16_4_ + local_2600._16_4_) * fVar84 * 0.0;
              fStack_254c = (fVar24 * auVar61._20_4_ + local_2600._20_4_) * fVar84 * 0.0;
              fStack_2548 = (fVar25 * auVar61._24_4_ + local_2600._24_4_) * fVar84 * 0.0;
              fStack_2544 = auVar61._28_4_ + local_2600._28_4_;
              auVar82._8_4_ = 0x7f800000;
              auVar82._0_8_ = 0x7f8000007f800000;
              auVar82._12_4_ = 0x7f800000;
              auVar82._16_4_ = 0x7f800000;
              auVar82._20_4_ = 0x7f800000;
              auVar82._24_4_ = 0x7f800000;
              auVar82._28_4_ = 0x7f800000;
              auVar61 = vblendmps_avx512vl(auVar82,local_2540);
              auVar77._0_4_ =
                   (uint)(local_259f & 1) * auVar61._0_4_ |
                   (uint)!(bool)(local_259f & 1) * 0x7f800000;
              bVar56 = (bool)(local_259f >> 1 & 1);
              auVar77._4_4_ = (uint)bVar56 * auVar61._4_4_ | (uint)!bVar56 * 0x7f800000;
              bVar56 = (bool)(local_259f >> 2 & 1);
              auVar77._8_4_ = (uint)bVar56 * auVar61._8_4_ | (uint)!bVar56 * 0x7f800000;
              bVar56 = (bool)(local_259f >> 3 & 1);
              auVar77._12_4_ = (uint)bVar56 * auVar61._12_4_ | (uint)!bVar56 * 0x7f800000;
              bVar56 = (bool)(local_259f >> 4 & 1);
              auVar77._16_4_ = (uint)bVar56 * auVar61._16_4_ | (uint)!bVar56 * 0x7f800000;
              bVar56 = (bool)(local_259f >> 5 & 1);
              auVar77._20_4_ = (uint)bVar56 * auVar61._20_4_ | (uint)!bVar56 * 0x7f800000;
              bVar56 = (bool)(local_259f >> 6 & 1);
              auVar77._24_4_ = (uint)bVar56 * auVar61._24_4_ | (uint)!bVar56 * 0x7f800000;
              auVar77._28_4_ =
                   (uint)(local_259f >> 7) * auVar61._28_4_ |
                   (uint)!(bool)(local_259f >> 7) * 0x7f800000;
              auVar61 = vshufps_avx(auVar77,auVar77,0xb1);
              auVar61 = vminps_avx(auVar77,auVar61);
              auVar62 = vshufpd_avx(auVar61,auVar61,5);
              auVar61 = vminps_avx(auVar61,auVar62);
              auVar62 = vpermpd_avx2(auVar61,0x4e);
              auVar61 = vminps_avx(auVar61,auVar62);
              uVar29 = vcmpps_avx512vl(auVar77,auVar61,0);
              uVar45 = uVar57;
              if ((local_259f & (byte)uVar29) != 0) {
                uVar45 = (uint)(local_259f & (byte)uVar29);
              }
              uVar113 = 0;
              for (; (uVar45 & 1) == 0; uVar45 = uVar45 >> 1 | 0x80000000) {
                uVar113 = uVar113 + 1;
              }
              local_2750 = (ulong)uVar113;
              local_2758 = context->args;
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                local_24c0 = auVar127._0_32_;
                local_24a0 = auVar126._0_32_;
                local_2480 = auVar125._0_32_;
                local_2460 = auVar124._0_32_;
                local_2440 = auVar123._0_32_;
                local_2420 = auVar121._0_32_;
                local_2400 = auVar120._0_32_;
                local_23e0 = auVar119._0_32_;
                local_2740 = context->user;
                local_2640 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                local_2660 = local_2540;
                do {
                  local_2684 = local_2580[local_2750];
                  local_2680 = local_2560[local_2750];
                  (ray->super_RayK<1>).tfar = *(float *)(local_2540 + local_2750 * 4);
                  local_2690 = *(float *)(local_2520 + local_2750 * 4);
                  local_268c = *(undefined4 *)(local_2500 + local_2750 * 4);
                  local_2688 = *(undefined4 *)(local_24e0 + local_2750 * 4);
                  local_267c = uVar7;
                  local_2678 = (int)local_2748;
                  local_2674 = local_2740->instID[0];
                  local_2670 = local_2740->instPrimID[0];
                  local_275c = -1;
                  local_26c0.valid = &local_275c;
                  local_26c0.geometryUserPtr = pGVar8->userPtr;
                  local_26c0.context = local_2740;
                  local_26c0.ray = (RTCRayN *)ray;
                  local_26c0.hit = (RTCHitN *)&local_2690;
                  local_26c0.N = 1;
                  if (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01c813d2:
                    if ((local_2758->filter != (RTCFilterFunctionN)0x0) &&
                       (((local_2758->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                      (*local_2758->filter)(&local_26c0);
                      auVar105 = ZEXT3264(local_2660);
                      if (*local_26c0.valid == 0) goto LAB_01c81480;
                    }
                    uVar48 = (uint)local_2750;
                    (((Vec3f *)((long)local_26c0.ray + 0x30))->field_0).field_0.x =
                         *(float *)local_26c0.hit;
                    (((Vec3f *)((long)local_26c0.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_26c0.hit + 4);
                    (((Vec3f *)((long)local_26c0.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_26c0.hit + 8);
                    *(float *)((long)local_26c0.ray + 0x3c) = *(float *)(local_26c0.hit + 0xc);
                    *(float *)((long)local_26c0.ray + 0x40) = *(float *)(local_26c0.hit + 0x10);
                    *(float *)((long)local_26c0.ray + 0x44) = *(float *)(local_26c0.hit + 0x14);
                    *(float *)((long)local_26c0.ray + 0x48) = *(float *)(local_26c0.hit + 0x18);
                    *(float *)((long)local_26c0.ray + 0x4c) = *(float *)(local_26c0.hit + 0x1c);
                    *(float *)((long)local_26c0.ray + 0x50) = *(float *)(local_26c0.hit + 0x20);
                  }
                  else {
                    (*pGVar8->intersectionFilterN)(&local_26c0);
                    auVar105 = ZEXT3264(local_2660);
                    if (*local_26c0.valid != 0) goto LAB_01c813d2;
LAB_01c81480:
                    uVar48 = (uint)local_2750;
                    (ray->super_RayK<1>).tfar = (float)local_2640._0_4_;
                  }
                  bVar44 = ~(byte)(1 << (uVar48 & 0x1f)) & (byte)uVar57;
                  fVar84 = (ray->super_RayK<1>).tfar;
                  auVar34._4_4_ = fVar84;
                  auVar34._0_4_ = fVar84;
                  auVar34._8_4_ = fVar84;
                  auVar34._12_4_ = fVar84;
                  auVar34._16_4_ = fVar84;
                  auVar34._20_4_ = fVar84;
                  auVar34._24_4_ = fVar84;
                  auVar34._28_4_ = fVar84;
                  uVar29 = vcmpps_avx512vl(auVar105._0_32_,auVar34,2);
                  if ((bVar44 & (byte)uVar29) == 0) goto LAB_01c8151e;
                  local_2640 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                  bVar44 = bVar44 & (byte)uVar29;
                  uVar57 = (uint)bVar44;
                  auVar83._8_4_ = 0x7f800000;
                  auVar83._0_8_ = 0x7f8000007f800000;
                  auVar83._12_4_ = 0x7f800000;
                  auVar83._16_4_ = 0x7f800000;
                  auVar83._20_4_ = 0x7f800000;
                  auVar83._24_4_ = 0x7f800000;
                  auVar83._28_4_ = 0x7f800000;
                  auVar61 = vblendmps_avx512vl(auVar83,auVar105._0_32_);
                  auVar78._0_4_ =
                       (uint)(bVar44 & 1) * auVar61._0_4_ | (uint)!(bool)(bVar44 & 1) * 0x7f800000;
                  bVar56 = (bool)(bVar44 >> 1 & 1);
                  auVar78._4_4_ = (uint)bVar56 * auVar61._4_4_ | (uint)!bVar56 * 0x7f800000;
                  bVar56 = (bool)(bVar44 >> 2 & 1);
                  auVar78._8_4_ = (uint)bVar56 * auVar61._8_4_ | (uint)!bVar56 * 0x7f800000;
                  bVar56 = (bool)(bVar44 >> 3 & 1);
                  auVar78._12_4_ = (uint)bVar56 * auVar61._12_4_ | (uint)!bVar56 * 0x7f800000;
                  bVar56 = (bool)(bVar44 >> 4 & 1);
                  auVar78._16_4_ = (uint)bVar56 * auVar61._16_4_ | (uint)!bVar56 * 0x7f800000;
                  bVar56 = (bool)(bVar44 >> 5 & 1);
                  auVar78._20_4_ = (uint)bVar56 * auVar61._20_4_ | (uint)!bVar56 * 0x7f800000;
                  bVar56 = (bool)(bVar44 >> 6 & 1);
                  auVar78._24_4_ = (uint)bVar56 * auVar61._24_4_ | (uint)!bVar56 * 0x7f800000;
                  auVar78._28_4_ =
                       (uint)(bVar44 >> 7) * auVar61._28_4_ |
                       (uint)!(bool)(bVar44 >> 7) * 0x7f800000;
                  auVar61 = vshufps_avx(auVar78,auVar78,0xb1);
                  auVar61 = vminps_avx(auVar78,auVar61);
                  auVar62 = vshufpd_avx(auVar61,auVar61,5);
                  auVar61 = vminps_avx(auVar61,auVar62);
                  auVar62 = vpermpd_avx2(auVar61,0x4e);
                  auVar61 = vminps_avx(auVar61,auVar62);
                  uVar29 = vcmpps_avx512vl(auVar78,auVar61,0);
                  bVar41 = (byte)uVar29 & bVar44;
                  if (bVar41 != 0) {
                    bVar44 = bVar41;
                  }
                  uVar48 = 0;
                  for (uVar45 = (uint)bVar44; (uVar45 & 1) == 0; uVar45 = uVar45 >> 1 | 0x80000000)
                  {
                    uVar48 = uVar48 + 1;
                  }
                  local_2750 = (ulong)uVar48;
                } while( true );
              }
              fVar84 = local_2580[local_2750];
              fVar85 = local_2560[local_2750];
              fVar115 = *(float *)(local_2520 + local_2750 * 4);
              fVar116 = *(float *)(local_2500 + local_2750 * 4);
              fVar19 = *(float *)(local_24e0 + local_2750 * 4);
              (ray->super_RayK<1>).tfar = *(float *)(local_2540 + local_2750 * 4);
              (ray->Ng).field_0.field_0.x = fVar115;
              (ray->Ng).field_0.field_0.y = fVar116;
              (ray->Ng).field_0.field_0.z = fVar19;
              ray->u = fVar84;
              ray->v = fVar85;
              ray->primID = uVar7;
              ray->geomID = uVar48;
              pRVar12 = context->user;
              ray->instID[0] = pRVar12->instID[0];
              ray->instPrimID[0] = pRVar12->instPrimID[0];
            }
          }
        }
      }
    }
    unaff_R15 = 0;
    uVar55 = local_26e0;
    uVar47 = local_26e8;
    uVar49 = local_26f0;
    uVar50 = local_26f8;
    uVar51 = local_2700;
    uVar52 = local_2708;
  }
  auVar61 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).tfar));
  auVar124 = ZEXT3264(auVar61);
  auVar105 = ZEXT3264(CONCAT428(0xfffffff8,
                                CONCAT424(0xfffffff8,
                                          CONCAT420(0xfffffff8,
                                                    CONCAT416(0xfffffff8,
                                                              CONCAT412(0xfffffff8,
                                                                        CONCAT48(0xfffffff8,
                                                                                 0xfffffff8fffffff8)
                                                                       ))))));
  goto LAB_01c807b3;
LAB_01c8151e:
  auVar119 = ZEXT3264(local_23e0);
  auVar120 = ZEXT3264(local_2400);
  auVar121 = ZEXT3264(local_2420);
  auVar61 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar122 = ZEXT3264(auVar61);
  auVar123 = ZEXT3264(local_2440);
  auVar124 = ZEXT3264(local_2460);
  auVar125 = ZEXT3264(local_2480);
  auVar126 = ZEXT3264(local_24a0);
  auVar127 = ZEXT3264(local_24c0);
  auVar61 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
  auVar128 = ZEXT3264(auVar61);
  goto LAB_01c80ca0;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }